

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_metadata.h
# Opt level: O0

void __thiscall
draco::GeometryMetadata::DeleteAttributeMetadataByUniqueId
          (GeometryMetadata *this,int32_t att_unique_id)

{
  bool bVar1;
  uint32_t uVar2;
  pointer this_00;
  uint32_t in_ESI;
  long in_RDI;
  iterator itr;
  vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  *in_stack_ffffffffffffffd0;
  const_iterator in_stack_ffffffffffffffd8;
  __normal_iterator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
  local_18;
  uint32_t local_c;
  
  if (-1 < (int)in_ESI) {
    local_c = in_ESI;
    local_18._M_current =
         (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> *)
         std::
         vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
         ::begin(in_stack_ffffffffffffffb8);
    while( true ) {
      std::
      vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
      ::end(in_stack_ffffffffffffffb8);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffffc0,
                         (__normal_iterator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
                          *)in_stack_ffffffffffffffb8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
      ::operator->(&local_18);
      this_00 = std::
                unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                ::get((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                       *)in_stack_ffffffffffffffc0);
      uVar2 = AttributeMetadata::att_unique_id(this_00);
      if (uVar2 == local_c) {
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>const*,std::vector<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>,std::allocator<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>>>>
        ::
        __normal_iterator<std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>*>
                  ((__normal_iterator<const_std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
                    *)(in_RDI + 0x60),
                   (__normal_iterator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
                    *)in_stack_ffffffffffffffb8);
        std::
        vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
        ::erase(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
        return;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
      ::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void DeleteAttributeMetadataByUniqueId(int32_t att_unique_id) {
    if (att_unique_id < 0) {
      return;
    }
    for (auto itr = att_metadatas_.begin(); itr != att_metadatas_.end();
         ++itr) {
      if (itr->get()->att_unique_id() == static_cast<uint32_t>(att_unique_id)) {
        att_metadatas_.erase(itr);
        return;
      }
    }
  }